

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O1

int64_t __thiscall
google::protobuf::io::CodedInputStream::ReadVarint32Fallback
          (CodedInputStream *this,uint32_t first_byte_or_zero)

{
  byte *pbVar1;
  long lVar2;
  byte *pbVar3;
  uint8_t *puVar4;
  uint uVar5;
  ulong uVar6;
  Nonnull<const_char_*> pcVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  byte *pbVar11;
  bool bVar12;
  pair<unsigned_long,_bool> pVar13;
  LogMessage LStack_28;
  
  puVar4 = this->buffer_end_;
  if (((int)puVar4 - (int)this->buffer_ < 10) &&
     ((puVar4 <= this->buffer_ || ((char)puVar4[-1] < '\0')))) {
    pVar13 = ReadVarint64Fallback(this);
    if (((undefined1  [16])pVar13 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      return -1;
    }
    return (ulong)(uint)pVar13.first;
  }
  if (first_byte_or_zero == 0) {
    pcVar7 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                       (0,0,"first_byte_or_zero != 0");
  }
  else {
    pcVar7 = (Nonnull<const_char_*>)0x0;
  }
  if (pcVar7 != (Nonnull<const_char_*>)0x0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&LStack_28,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.cc"
               ,0x207,pcVar7);
    absl::lts_20250127::log_internal::LogMessage::operator<<
              (&LStack_28,
               (char (*) [64])"Caller should provide us with *buffer_ when buffer is non-empty");
LAB_002307b7:
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&LStack_28);
  }
  pbVar11 = this->buffer_;
  if (*pbVar11 == first_byte_or_zero) {
    pcVar7 = (Nonnull<const_char_*>)0x0;
  }
  else {
    pcVar7 = absl::lts_20250127::log_internal::MakeCheckOpString<unsigned_char,long>
                       (*pbVar11,(ulong)first_byte_or_zero,"*buffer == first_byte");
  }
  if (pcVar7 != (Nonnull<const_char_*>)0x0) {
    ReadVarint32Fallback();
    goto LAB_002307b7;
  }
  if ((first_byte_or_zero & 0x80) == 0) {
    pcVar7 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                       (0,0x80,"first_byte & 0x80 == 0x80");
  }
  else {
    pcVar7 = (Nonnull<const_char_*>)0x0;
  }
  if (pcVar7 != (Nonnull<const_char_*>)0x0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&LStack_28,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.cc"
               ,0x1af,pcVar7);
    absl::lts_20250127::log_internal::LogMessage::operator<<(&LStack_28,first_byte_or_zero);
    goto LAB_002307b7;
  }
  uVar5 = ((uint)pbVar11[1] * 0x80 + first_byte_or_zero) - 0x80;
  if ((char)pbVar11[1] < '\0') {
    uVar5 = (uVar5 + (uint)pbVar11[2] * 0x4000) - 0x4000;
    if ((char)pbVar11[2] < '\0') {
      uVar5 = (uVar5 + (uint)pbVar11[3] * 0x200000) - 0x200000;
      if ((char)pbVar11[3] < '\0') {
        uVar5 = uVar5 + (uint)pbVar11[4] * 0x10000000 + 0xf0000000;
        if ((char)pbVar11[4] < '\0') {
          pbVar1 = pbVar11 + 6;
          if ((char)pbVar11[5] < '\0') {
            pbVar11 = pbVar11 + 10;
            lVar10 = 0;
            do {
              uVar8 = (uint)lVar10;
              if (uVar8 == 4) goto LAB_0023074f;
              lVar2 = lVar10 + 1;
              pbVar3 = pbVar1 + lVar10;
              lVar10 = lVar2;
            } while ((char)*pbVar3 < '\0');
            pbVar11 = pbVar1 + lVar2;
LAB_0023074f:
            bVar12 = 3 < uVar8;
          }
          else {
            bVar12 = false;
            pbVar11 = pbVar1;
          }
          if (bVar12) {
            uVar9 = 0;
            bVar12 = false;
            goto LAB_00230704;
          }
        }
        else {
          pbVar11 = pbVar11 + 5;
        }
      }
      else {
        pbVar11 = pbVar11 + 4;
      }
    }
    else {
      pbVar11 = pbVar11 + 3;
    }
  }
  else {
    pbVar11 = pbVar11 + 2;
  }
  uVar9 = (ulong)uVar5;
  bVar12 = true;
LAB_00230704:
  uVar6 = 0xffffffffffffffff;
  if (bVar12) {
    this->buffer_ = pbVar11;
    uVar6 = uVar9;
  }
  return uVar6;
}

Assistant:

int64_t CodedInputStream::ReadVarint32Fallback(uint32_t first_byte_or_zero) {
  if (BufferSize() >= kMaxVarintBytes ||
      // Optimization:  We're also safe if the buffer is non-empty and it ends
      // with a byte that would terminate a varint.
      (buffer_end_ > buffer_ && !(buffer_end_[-1] & 0x80))) {
    ABSL_DCHECK_NE(first_byte_or_zero, 0)
        << "Caller should provide us with *buffer_ when buffer is non-empty";
    uint32_t temp;
    ::std::pair<bool, const uint8_t*> p =
        ReadVarint32FromArray(first_byte_or_zero, buffer_, &temp);
    if (!p.first) return -1;
    buffer_ = p.second;
    return temp;
  } else {
    // Really slow case: we will incur the cost of an extra function call here,
    // but moving this out of line reduces the size of this function, which
    // improves the common case. In micro benchmarks, this is worth about 10-15%
    uint32_t temp;
    return ReadVarint32Slow(&temp) ? static_cast<int64_t>(temp) : -1;
  }
}